

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint64_t farmhashna::HashLen17to32(char *s,size_t len)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t val;
  uint64_t uVar5;
  uint64_t uVar6;
  long in_RSI;
  char *in_RDI;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t mul;
  int in_stack_ffffffffffffffac;
  uint64_t in_stack_ffffffffffffffb0;
  
  uVar1 = in_RSI * 2 + 0x9ae16a3b2f90404f;
  uVar2 = util::Fetch64(in_RDI);
  util::Fetch64(in_RDI + 8);
  uVar3 = util::Fetch64(in_RDI + in_RSI + -8);
  uVar4 = util::Fetch64(in_RDI + in_RSI + -0x10);
  val = util::Rotate64(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  uVar5 = util::Rotate64(val,in_stack_ffffffffffffffac);
  uVar6 = util::Rotate64(val,in_stack_ffffffffffffffac);
  uVar1 = HashLen16(val + uVar5 + uVar4 * -0x651e95c4d06fbfb1,
                    uVar2 * -0x4b6d499041670d8d + uVar6 + uVar3 * uVar1,uVar1);
  return uVar1;
}

Assistant:

STATIC_INLINE uint64_t HashLen17to32(const char *s, size_t len) {
  uint64_t mul = k2 + len * 2;
  uint64_t a = Fetch(s) * k1;
  uint64_t b = Fetch(s + 8);
  uint64_t c = Fetch(s + len - 8) * mul;
  uint64_t d = Fetch(s + len - 16) * k2;
  return HashLen16(Rotate(a + b, 43) + Rotate(c, 30) + d,
                   a + Rotate(b + k2, 18) + c, mul);
}